

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

int CVmObjString::getp_len(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  int iVar1;
  size_t sVar2;
  
  if (getp_len(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    iVar1 = __cxa_guard_acquire(&getp_len(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc
                               );
    if (iVar1 != 0) {
      getp_len::desc.min_argc_ = 0;
      getp_len::desc.opt_argc_ = 0;
      getp_len::desc.varargs_ = 0;
      __cxa_guard_release(&getp_len(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
    }
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_len::desc);
  if (iVar1 == 0) {
    sVar2 = utf8_ptr::s_len(str + 2,(ulong)*(ushort *)str);
    retval->typ = VM_INT;
    (retval->val).obj = (vm_obj_id_t)sVar2;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_len(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                           const char *str, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* set up a utf-8 pointer to the string's contents */
    utf8_ptr p;
    p.set((char *)str + VMB_LEN);

    /* return the character length of the string */
    retval->set_int(p.len(vmb_get_len(str)));

    /* handled */
    return TRUE;
}